

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutCompareDelay(If_Man_t *p,If_Cut_t **ppC0,If_Cut_t **ppC1)

{
  If_Cut_t *pIVar1;
  If_Cut_t *pIVar2;
  If_Cut_t *pC1;
  If_Cut_t *pC0;
  If_Cut_t **ppC1_local;
  If_Cut_t **ppC0_local;
  If_Man_t *p_local;
  
  pIVar1 = *ppC0;
  pIVar2 = *ppC1;
  if (pIVar2->Delay - p->fEpsilon <= pIVar1->Delay) {
    if (pIVar1->Delay <= pIVar2->Delay + p->fEpsilon) {
      if (*(uint *)&pIVar1->field_0x1c >> 0x18 < *(uint *)&pIVar2->field_0x1c >> 0x18) {
        p_local._4_4_ = -1;
      }
      else if (*(uint *)&pIVar2->field_0x1c >> 0x18 < *(uint *)&pIVar1->field_0x1c >> 0x18) {
        p_local._4_4_ = 1;
      }
      else if (pIVar2->Area - p->fEpsilon <= pIVar1->Area) {
        if (pIVar1->Area <= pIVar2->Area + p->fEpsilon) {
          p_local._4_4_ = 0;
        }
        else {
          p_local._4_4_ = 1;
        }
      }
      else {
        p_local._4_4_ = -1;
      }
    }
    else {
      p_local._4_4_ = 1;
    }
  }
  else {
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

int If_CutCompareDelay( If_Man_t * p, If_Cut_t ** ppC0, If_Cut_t ** ppC1 )
{
    If_Cut_t * pC0 = *ppC0;
    If_Cut_t * pC1 = *ppC1;
    if ( pC0->Delay < pC1->Delay - p->fEpsilon )
        return -1;
    if ( pC0->Delay > pC1->Delay + p->fEpsilon )
        return 1;
    if ( pC0->nLeaves < pC1->nLeaves )
        return -1;
    if ( pC0->nLeaves > pC1->nLeaves )
        return 1;
    if ( pC0->Area < pC1->Area - p->fEpsilon )
        return -1;
    if ( pC0->Area > pC1->Area + p->fEpsilon )
        return 1;
    return 0;
}